

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_JP2K.cpp
# Opt level: O3

void __thiscall AS_02::JP2K::MXFReader::DumpIndex(MXFReader *this,FILE *stream)

{
  h__Reader *phVar1;
  char cVar2;
  
  phVar1 = (this->m_Reader).m_p;
  if (phVar1 != (h__Reader *)0x0) {
    cVar2 = (**(code **)(*(long *)(phVar1->super_h__AS02Reader).
                                  super_TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>
                                  .m_File + 0x40))();
    if (cVar2 != '\0') {
      MXF::AS02IndexReader::Dump
                (&(((this->m_Reader).m_p)->super_h__AS02Reader).
                  super_TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>.
                  m_IndexAccess,stream);
      return;
    }
  }
  return;
}

Assistant:

Result_t
AS_02::JP2K::MXFWriter::h__Writer::SetSourceStream(const std::string& label, const ASDCP::Rational& edit_rate)
{
  assert(m_Dict);
  if ( ! m_State.Test_INIT() )
    {
      KM_RESULT_STATE_HERE();
	return RESULT_STATE;
    }

  memcpy(m_EssenceUL, m_Dict->ul(MDD_JPEG2000Essence), SMPTE_UL_LENGTH);
  m_EssenceUL[SMPTE_UL_LENGTH-1] = 1; // first (and only) essence container
  Result_t result = m_State.Goto_READY();

  if ( KM_SUCCESS(result) )
    {
      UL wrapping_label = UL(m_Dict->ul(MDD_MXFGCP1FrameWrappedPictureElement));

      CDCIEssenceDescriptor *cdci_descriptor = dynamic_cast<CDCIEssenceDescriptor*>(m_EssenceDescriptor);
      if ( cdci_descriptor )
	{
	  if ( cdci_descriptor->FrameLayout ) // 0 == progressive, 1 == interlace
	    {
	      wrapping_label = UL(m_Dict->ul(MDD_MXFGCI1FrameWrappedPictureElement));
	    }
	}

      result = WriteAS02Header(label, wrapping_label,
			       PICT_DEF_LABEL, UL(m_EssenceUL), UL(m_Dict->ul(MDD_PictureDataDef)),
			       edit_rate);

      if ( KM_SUCCESS(result) )
	{
	  this->m_IndexWriter.SetPrimerLookup(&this->m_HeaderPart.m_Primer);
	  this->m_IndexWriter.SetEditRate(m_EssenceDescriptor->SampleRate);
	}
    }

  return result;
}